

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

void phyr::blackbody(double *lambda,int n,double t,double *Le)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  if (t <= 0.0) {
    if (0 < n) {
      memset(Le,0,(ulong)(uint)n << 3);
      return;
    }
  }
  else if (0 < n) {
    uVar1 = 0;
    do {
      dVar3 = lambda[uVar1] * 1e-09;
      dVar2 = exp(1.9864456832693028e-25 / (dVar3 * 1.3806488e-23 * t));
      Le[uVar1] = 1.1910428681415875e-16 / ((dVar2 + -1.0) * dVar3 * dVar3 * dVar3 * dVar3 * dVar3);
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  return;
}

Assistant:

void blackbody(const Real* lambda, int n, Real t, Real* Le) {
    if (t <= 0) {
        for (int i = 0; i < n; ++i) Le[i] = 0.f;
        return;
    }
    const Real c = 299792458;
    const Real h = 6.62606957e-34;
    const Real kb = 1.3806488e-23;
    for (int i = 0; i < n; ++i) {
        // Compute emitted radiance for blackbody at wavelength {lambda[i]}
        Real l = lambda[i] * 1e-9;
        Real lambda5 = (l * l) * (l * l) * l;
        Le[i] = (2 * h * c * c) /
                (lambda5 * (std::exp((h * c) / (l * kb * t)) - 1));
        ASSERT(!std::isnan(Le[i]));
    }
}